

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
  *pFVar2;
  value_type vVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  vVar3 = FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  dVar4 = cos((this->right_->fadexpr_).expr_.val_);
  dVar1 = (this->right_->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar5 = sin((this->right_->fadexpr_).expr_.val_);
  pFVar2 = this->left_;
  dVar6 = ::exp(-((((pFVar2->fadexpr_).left_)->fadexpr_).expr_.fadexpr_.expr_)->val_);
  dVar7 = ::exp((((pFVar2->fadexpr_).right_)->fadexpr_).expr_.val_);
  return dVar4 * vVar3 - (dVar6 - dVar7) * dVar5 * dVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}